

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

void __thiscall String::String(String *this,Type *on)

{
  ulong uVar1;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  Type *local_18;
  Type *on_local;
  String *this_local;
  
  *(undefined ***)this = &PTR__String_0011e990;
  local_18 = on;
  on_local = (Type *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"/std/string",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"/std/string",&local_71);
  uVar1 = (**(code **)(*(long *)this + 0xc0))();
  Typelib::Container::Container(&this->super_Container,local_38,local_70,uVar1,local_18);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *(undefined ***)this = &PTR__String_0011e990;
  return;
}

Assistant:

String::String(Type const& on)
    : Container("/std/string", "/std/string", getNaturalSize(), on) {
}